

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

bool __thiscall TTD::ExecutionInfoManager::IsFinalSourceLine(ExecutionInfoManager *this)

{
  uint startOffset;
  SingleCallCounter *pSVar1;
  undefined4 in_ECX;
  undefined4 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  ULONG local_30;
  uint32 local_2c;
  ULONG srcLine;
  LONG srcColumn;
  
  pSVar1 = GetTopCallCounter(this);
  auVar4._0_8_ = -(ulong)((this->m_innerloopLastLocation).m_functionTime == pSVar1->FunctionTime);
  auVar4._8_8_ = -(ulong)((this->m_innerloopLastLocation).m_loopTime == pSVar1->LoopTime);
  uVar2 = movmskpd(in_ECX,auVar4);
  if ((byte)((byte)uVar2 >> 1 &
            (this->m_innerloopLastLocation).m_eventTime == this->m_topLevelCallbackEventTime &
            (byte)uVar2) == 1) {
    local_30 = 0;
    local_2c = 0xffffffff;
    startOffset = Js::FunctionBody::GetStatementStartOffset
                            (pSVar1->Function,pSVar1->CurrentStatementIndex);
    Js::FunctionBody::GetSourceLineFromStartOffset_TTD
              (pSVar1->Function,startOffset,&local_30,(LONG *)&local_2c);
    bVar3 = (this->m_innerloopLastLocation).m_column == local_2c &&
            (this->m_innerloopLastLocation).m_line == local_30;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ExecutionInfoManager::IsFinalSourceLine() const
    {
        const SingleCallCounter& cfinfo = this->GetTopCallCounter();

        if(!this->m_innerloopLastLocation.CheckLastTimeMatch(this->m_topLevelCallbackEventTime, cfinfo.FunctionTime, cfinfo.LoopTime))
        {
            return false;
        }

        ULONG srcLine = 0;
        LONG srcColumn = -1;
        uint32 startOffset = cfinfo.Function->GetStatementStartOffset(cfinfo.CurrentStatementIndex);
        cfinfo.Function->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);
        return this->m_innerloopLastLocation.CheckLineColumnMatch((uint32) srcLine, (uint32)srcColumn);
    }